

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O1

base_learner * confidence_setup(options_i *options,vw *all)

{
  option_group_definition *this;
  confidence *dat;
  base_learner *l;
  single_learner *base;
  learner<confidence,_example> *plVar1;
  code *learn;
  code *predict;
  bool confidence_after_training;
  bool confidence_arg;
  size_type __dnew_2;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  bool local_25a;
  bool local_259;
  vw *local_258;
  long local_250;
  long *local_248;
  long local_240;
  long local_238 [2];
  option_group_definition local_228;
  string local_1f0;
  _func_int ***local_1d0;
  _func_int **local_1c8;
  _func_int **local_1c0 [2];
  string local_1b0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined2 local_178;
  undefined1 local_176;
  undefined1 local_170 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_259 = false;
  local_25a = false;
  local_180 = 0x6e656469666e6f43;
  local_178 = 0x6563;
  local_188 = 10;
  local_176 = 0;
  local_228.m_name._M_dataplus._M_p = (pointer)&local_228.m_name.field_2;
  local_258 = all;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char*>((string *)&local_228,&local_180);
  local_228.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  local_1b0.field_2._M_allocated_capacity = 0x6e656469666e6f63;
  local_1b0.field_2._8_2_ = 0x6563;
  local_1b0._M_string_length = 10;
  local_1b0.field_2._M_local_buf[10] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_d0,&local_1b0,&local_259)
  ;
  local_60 = true;
  local_170._0_8_ = (_func_int **)0x25;
  local_1d0 = local_1c0;
  local_1d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)local_170);
  local_1c0[0] = (_func_int **)local_170._0_8_;
  local_1d0[2] = (_func_int **)0x72616e696220726f;
  local_1d0[3] = (_func_int **)0x6369646572702079;
  *local_1d0 = (_func_int **)0x666e6f6320746547;
  local_1d0[1] = (_func_int **)0x662065636e656469;
  builtin_strncpy((char *)((long)local_1d0 + 0x1d),"dictions",8);
  local_1c8 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_1d0 + local_170._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                   (&local_228,(typed_option<bool> *)local_d0);
  local_248 = (long *)0x19;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1f0,(ulong)&local_248);
  local_1f0.field_2._M_allocated_capacity = (size_type)local_248;
  builtin_strncpy(local_1f0._M_dataplus._M_p,"confidence_after_training",0x19);
  local_1f0._M_string_length = (size_type)local_248;
  local_1f0._M_dataplus._M_p[(long)local_248] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_1f0,&local_25a);
  local_250 = 0x19;
  local_248 = local_238;
  local_248 = (long *)std::__cxx11::string::_M_create((ulong *)&local_248,(ulong)&local_250);
  local_238[0] = local_250;
  builtin_strncpy((char *)((long)local_248 + 9),"e after ",8);
  builtin_strncpy((char *)((long)local_248 + 0x11),"training",8);
  *local_248 = 0x6e656469666e6f43;
  local_248[1] = 0x7265746661206563;
  local_240 = local_250;
  *(char *)((long)local_248 + local_250) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (this,(typed_option<bool> *)local_170);
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  local_170._0_8_ = &PTR__typed_option_002d4dd0;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  local_d0._0_8_ = &PTR__typed_option_002d4dd0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_228);
  if (local_259 != false) {
    if (local_258->training != false) {
      dat = calloc_or_throw<confidence>(1);
      dat->all = local_258;
      learn = predict_or_learn_with_confidence<true,false>;
      if (local_25a != false) {
        learn = predict_or_learn_with_confidence<true,true>;
      }
      predict = predict_or_learn_with_confidence<false,false>;
      if (local_25a != false) {
        predict = predict_or_learn_with_confidence<false,true>;
      }
      l = setup_base(options,local_258);
      base = LEARNER::as_singleline<char,char>(l);
      plVar1 = LEARNER::learner<confidence,example>::init_learner<LEARNER::learner<char,example>>
                         (dat,base,learn,predict,1,*(prediction_type_t *)(base + 0xd0));
      *(undefined8 *)(plVar1 + 0x58) = *(undefined8 *)(plVar1 + 0x18);
      *(code **)(plVar1 + 0x68) = return_confidence_example;
      goto LAB_001d0a6d;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when saving the model and avoid --test_only"
               ,0x90);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  plVar1 = (learner<confidence,_example> *)0x0;
LAB_001d0a6d:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_228.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_name._M_dataplus._M_p != &local_228.m_name.field_2) {
    operator_delete(local_228.m_name._M_dataplus._M_p);
  }
  return (base_learner *)plVar1;
}

Assistant:

base_learner* confidence_setup(options_i& options, vw& all)
{
  bool confidence_arg = false;
  bool confidence_after_training = false;
  option_group_definition new_options("Confidence");
  new_options.add(make_option("confidence", confidence_arg).keep().help("Get confidence for binary predictions"))
      .add(make_option("confidence_after_training", confidence_after_training).help("Confidence after training"));
  options.add_and_parse(new_options);

  if (!confidence_arg)
    return nullptr;

  if (!all.training)
  {
    cout << "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when "
            "saving the model and avoid --test_only"
         << endl;
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<confidence>();
  data->all = &all;

  void (*learn_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;
  void (*predict_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;

  if (confidence_after_training)
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, true>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, true>;
  }
  else
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, false>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, false>;
  }

  // Create new learner
  learner<confidence, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), learn_with_confidence_ptr, predict_with_confidence_ptr);

  l.set_finish_example(return_confidence_example);

  return make_base(l);
}